

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebugger.cxx
# Opt level: O3

bool __thiscall cmDebugger_impl::ClearWatchpoint(cmDebugger_impl *this,watchpoint_id id)

{
  _Rb_tree_header *p_Var1;
  size_t sVar2;
  int iVar3;
  _Atomic_word _Var4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  size_t sVar7;
  bool bVar8;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_long,_std::weak_ptr<cmDebugger_impl::Watchpoint>_>_>,_std::_Rb_tree_iterator<std::pair<const_unsigned_long,_std::weak_ptr<cmDebugger_impl::Watchpoint>_>_>_>
  pVar9;
  watchpoint_id local_38;
  
  local_38 = id;
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->breakpointMutex);
  if (iVar3 != 0) {
    std::__throw_system_error(iVar3);
  }
  p_Var5 = (this->activeWatchpoints)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var5 != (_Base_ptr)0x0) {
    p_Var1 = &(this->activeWatchpoints)._M_t._M_impl.super__Rb_tree_header;
    p_Var6 = &p_Var1->_M_header;
    do {
      if (*(ulong *)(p_Var5 + 1) >= id) {
        p_Var6 = p_Var5;
      }
      p_Var5 = (&p_Var5->_M_left)[*(ulong *)(p_Var5 + 1) < id];
    } while (p_Var5 != (_Base_ptr)0x0);
    if ((_Rb_tree_header *)p_Var6 != p_Var1) {
      sVar7 = (this->activeWatchpoints)._M_t._M_impl.super__Rb_tree_header._M_node_count;
      if ((*(ulong *)(p_Var6 + 1) <= id) && (p_Var5 = p_Var6[1]._M_left, p_Var5 != (_Base_ptr)0x0))
      {
        _Var4 = *(_Atomic_word *)&p_Var5->_M_parent;
        do {
          if (_Var4 == 0) goto LAB_003b86ae;
          LOCK();
          iVar3 = *(int *)&p_Var5->_M_parent;
          bVar8 = _Var4 == iVar3;
          if (bVar8) {
            *(_Atomic_word *)&p_Var5->_M_parent = _Var4 + 1;
            iVar3 = _Var4;
          }
          _Var4 = iVar3;
          UNLOCK();
        } while (!bVar8);
        if ((*(int *)&p_Var5->_M_parent != 0) &&
           (p_Var6 = p_Var6[1]._M_parent, p_Var6 != (_Base_ptr)0x0)) {
          cmVariableWatch::RemoveWatch
                    (this->CMakeInstance->VariableWatch,(string *)&p_Var6->_M_left,WatchMethodCB,
                     p_Var6[1]._M_right);
          pVar9 = std::
                  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::weak_ptr<cmDebugger_impl::Watchpoint>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::weak_ptr<cmDebugger_impl::Watchpoint>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::weak_ptr<cmDebugger_impl::Watchpoint>_>_>_>
                  ::equal_range(&(this->activeWatchpoints)._M_t,&local_38);
          std::
          _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::weak_ptr<cmDebugger_impl::Watchpoint>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::weak_ptr<cmDebugger_impl::Watchpoint>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::weak_ptr<cmDebugger_impl::Watchpoint>_>_>_>
          ::_M_erase_aux(&(this->activeWatchpoints)._M_t,(_Base_ptr)pVar9.first._M_node,
                         (_Base_ptr)pVar9.second._M_node);
        }
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var5);
      }
      goto LAB_003b86ae;
    }
  }
  sVar7 = (this->activeWatchpoints)._M_t._M_impl.super__Rb_tree_header._M_node_count;
LAB_003b86ae:
  sVar2 = (this->activeWatchpoints)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  pthread_mutex_unlock((pthread_mutex_t *)&this->breakpointMutex);
  return sVar7 != sVar2;
}

Assistant:

bool ClearWatchpoint(watchpoint_id id) override
  {
    std::lock_guard<std::mutex> l(breakpointMutex);
    auto watchpointIt = activeWatchpoints.find(id);
    auto originalSize = activeWatchpoints.size();
    if (watchpointIt != activeWatchpoints.end()) {
      if (auto watchpoint = watchpointIt->second.lock()) {
        this->CMakeInstance.GetVariableWatch()->RemoveWatch(
          watchpoint->Variable, WatchMethodCB, watchpoint->user_data);
        activeWatchpoints.erase(id);
      }
    }

    return originalSize != activeWatchpoints.size();
  }